

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O0

void GenCodeCmdStoreDouble(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  undefined4 local_20;
  undefined4 local_1c;
  x86Reg address;
  x86XmmReg temp;
  CodeGenRegVmContext *ctx_local;
  RegVmCmd cmd_local;
  
  ctx_local._1_1_ = cmd.rA;
  local_1c = CodeGenGenericContext::FindXmmRegAtMemory
                       (&ctx->ctx,sQWORD,rNONE,1,rEBX,(uint)ctx_local._1_1_ << 3,true);
  if (local_1c == rXmmRegCount) {
    local_1c = CodeGenGenericContext::GetXmmReg(&ctx->ctx);
    EMIT_OP_REG_RPTR(&ctx->ctx,o_movsd,local_1c,sQWORD,rEBX,(uint)ctx_local._1_1_ << 3);
  }
  ctx_local._3_1_ = cmd.rC;
  ctx_local._4_4_ = cmd.argument;
  if (ctx_local._3_1_ == 1) {
    EMIT_OP_RPTR_REG(&ctx->ctx,o_movsd,sQWORD,rR15,ctx_local._4_4_,local_1c);
  }
  else {
    local_20 = CodeGenGenericContext::FindRegAtMemory
                         (&ctx->ctx,sQWORD,rNONE,1,rEBX,(uint)ctx_local._3_1_ << 3,true);
    if (local_20 == rRegCount) {
      local_20 = rEAX;
      EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEAX,sQWORD,rEBX,(uint)ctx_local._3_1_ << 3);
    }
    EMIT_OP_RPTR_REG(&ctx->ctx,o_movsd,sQWORD,local_20,ctx_local._4_4_,local_1c);
  }
  return;
}

Assistant:

void GenCodeCmdStoreDouble(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
#if defined(_M_X64)
	x86XmmReg temp = ctx.ctx.FindXmmRegAtMemory(sQWORD, rNONE, 1, rREG, cmd.rA * 8, true);

	if(temp == rXmmRegCount)
	{
		temp = ctx.ctx.GetXmmReg();

		EMIT_OP_REG_RPTR(ctx.ctx, o_movsd, temp, sQWORD, rREG, cmd.rA * 8); // Load value
	}

	if(cmd.rC == rvrrFrame)
	{
		EMIT_OP_RPTR_REG(ctx.ctx, o_movsd, sQWORD, rR15, cmd.argument, temp); // Store double value
	}
	else
	{
		x86Reg address = ctx.ctx.FindRegAtMemory(sQWORD, rNONE, 1, rREG, cmd.rC * 8, true);

		if(address == rRegCount)
		{
			address = rRAX;

			EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRAX, sQWORD, rREG, cmd.rC * 8); // Load target pointer
		}

		EMIT_OP_RPTR_REG(ctx.ctx, o_movsd, sQWORD, address, cmd.argument, temp); // Store value to target with an offset
	}
#else
	x86XmmReg temp = ctx.ctx.GetXmmReg();

	EMIT_OP_REG_RPTR(ctx.ctx, o_movsd, temp, sQWORD, rREG, cmd.rA * 8); // Load value

	x86GenCodeStoreDoubleToPointer(ctx, rEAX, temp, cmd.rC, cmd.argument);
#endif
}